

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::KurtosisState,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>>
               (double *idata,AggregateInputData *aggr_input_data,KurtosisState *state,idx_t count,
               ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  AggregateUnaryInput local_48;
  
  local_48.input_idx = 0;
  uVar5 = 0;
  uVar7 = 0;
  uVar9 = 0;
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  do {
    if (uVar7 == count + 0x3f >> 6) {
      return;
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar8 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar8 = count;
      }
LAB_01c229d7:
      while (uVar6 = uVar9, uVar3 = uVar5, iVar4 = local_48.input_idx, uVar9 < uVar8) {
        KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>::
        Operation<double,duckdb::KurtosisState,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>>
                  (state,idata + uVar9,&local_48);
        uVar5 = local_48.input_idx + 1;
        local_48.input_idx = uVar5;
        uVar9 = uVar5;
      }
    }
    else {
      uVar2 = puVar1[uVar7];
      uVar8 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar8 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_01c229d7;
      uVar6 = uVar8;
      uVar3 = uVar8;
      iVar4 = uVar8;
      if (uVar2 != 0) {
        while (uVar6 = uVar5, uVar3 = uVar5, iVar4 = local_48.input_idx, uVar5 < uVar8) {
          if ((uVar2 >> ((ulong)(uint)((int)uVar5 - (int)uVar9) & 0x3f) & 1) != 0) {
            KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>::
            Operation<double,duckdb::KurtosisState,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>>
                      (state,idata + uVar5,&local_48);
            uVar5 = local_48.input_idx;
          }
          uVar5 = uVar5 + 1;
          local_48.input_idx = uVar5;
        }
      }
    }
    local_48.input_idx = iVar4;
    uVar5 = uVar3;
    uVar7 = uVar7 + 1;
    uVar9 = uVar6;
  } while( true );
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}